

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# D3MFImporter.cpp
# Opt level: O1

void __thiscall Assimp::D3MF::XmlSerializer::ImportTriangles(XmlSerializer *this,aiMesh *mesh)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong *puVar4;
  aiFace *paVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  pointer o;
  aiFace *this_00;
  vector<aiFace,_std::allocator<aiFace>_> faces;
  string nodeName;
  vector<aiFace,_std::allocator<aiFace>_> local_78;
  undefined1 local_60 [16];
  pointer local_50;
  pointer local_40;
  
  local_78.super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.super__Vector_impl_data.
  _M_start = (aiFace *)0x0;
  local_78.super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_78.super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  while( true ) {
    bVar1 = ReadToEndElement(this,(string *)XmlTag::triangles_abi_cxx11_);
    o = local_78.super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.super__Vector_impl_data
        ._M_start;
    if (!bVar1) break;
    iVar2 = (*this->xmlReader->_vptr_IIrrXMLReader[0xd])();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,(char *)CONCAT44(extraout_var,iVar2),(allocator<char> *)local_60)
    ;
    (*this->xmlReader->_vptr_IIrrXMLReader[0xd])();
    iVar2 = std::__cxx11::string::compare(XmlTag::triangle_abi_cxx11_);
    if (iVar2 == 0) {
      ReadTriangle((XmlSerializer *)local_60);
      std::vector<aiFace,_std::allocator<aiFace>_>::emplace_back<aiFace>
                (&local_78,(aiFace *)local_60);
      if ((pointer)local_60._8_8_ != (pointer)0x0) {
        operator_delete__((void *)local_60._8_8_);
      }
      iVar2 = (*this->xmlReader->_vptr_IIrrXMLReader[7])(this->xmlReader,XmlTag::p1_abi_cxx11_);
      if ((char *)CONCAT44(extraout_var_00,iVar2) != (char *)0x0) {
        uVar3 = atoi((char *)CONCAT44(extraout_var_00,iVar2));
        mesh->mMaterialIndex = uVar3;
      }
    }
    if (local_50 != (pointer)&local_40) {
      operator_delete(local_50,(long)local_40 + 1);
    }
  }
  uVar6 = (long)local_78.super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_78.super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.
                super__Vector_impl_data._M_start >> 4;
  mesh->mNumFaces = (uint)uVar6;
  uVar8 = uVar6 & 0xffffffff;
  puVar4 = (ulong *)operator_new__(uVar8 * 0x10 + 8);
  *puVar4 = uVar8;
  this_00 = (aiFace *)(puVar4 + 1);
  if (uVar8 != 0) {
    paVar5 = this_00;
    do {
      paVar5->mNumIndices = 0;
      paVar5->mIndices = (uint *)0x0;
      paVar5 = paVar5 + 1;
    } while (paVar5 != this_00 + uVar8);
  }
  mesh->mFaces = this_00;
  mesh->mPrimitiveTypes = 4;
  if (0 < (long)uVar6) {
    lVar7 = uVar6 + 1;
    do {
      aiFace::operator=(this_00,o);
      o = o + 1;
      this_00 = this_00 + 1;
      lVar7 = lVar7 + -1;
    } while (1 < lVar7);
  }
  std::vector<aiFace,_std::allocator<aiFace>_>::~vector(&local_78);
  return;
}

Assistant:

void ImportTriangles(aiMesh* mesh) {
         std::vector<aiFace> faces;

         while(ReadToEndElement(D3MF::XmlTag::triangles)) {
             const std::string nodeName( xmlReader->getNodeName() );
             if(xmlReader->getNodeName() == D3MF::XmlTag::triangle) {
                 faces.push_back(ReadTriangle());
                 const char *pidToken( xmlReader->getAttributeValue( D3MF::XmlTag::p1.c_str() ) );
                 if ( nullptr != pidToken ) {
                     int matIdx( std::atoi( pidToken ) );
                     mesh->mMaterialIndex = matIdx;
                 }
             }
         }

        mesh->mNumFaces = static_cast<unsigned int>(faces.size());
        mesh->mFaces = new aiFace[mesh->mNumFaces];
        mesh->mPrimitiveTypes = aiPrimitiveType_TRIANGLE;

        std::copy(faces.begin(), faces.end(), mesh->mFaces);
    }